

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::FinishPartialCollect
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar6;
  SmallHeapBlockT<MediumAllocationBlockAttributes> **ppSVar7;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *list;
  anon_class_16_2_3fe61e0b fn;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *local_30;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail;
  
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,bVar2);
  pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
  if (pRVar4->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x253,"(this->GetRecycler()->inPartialCollectMode)",
                       "this->GetRecycler()->inPartialCollectMode");
    if (!bVar2) goto LAB_006b4275;
    *puVar5 = 0;
  }
  if (recyclerSweep != (RecyclerSweep *)0x0) {
    bVar2 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
            ::IsAllocationStopped
                      (&this->
                        super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                      );
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,600,"(recyclerSweep == nullptr || this->IsAllocationStopped())",
                         "recyclerSweep == nullptr || this->IsAllocationStopped()");
      if (!bVar2) goto LAB_006b4275;
      *puVar5 = 0;
    }
  }
  list = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->partialSweptHeapBlockList;
  if (list == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    list = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->partialHeapBlockList;
  }
  else {
    this->partialSweptHeapBlockList =
         (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    local_30 = (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    fn.tail = &local_30;
    fn.this = this;
    HeapBlockList::
    ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::FinishPartialCollect(Memory::RecyclerSweep*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
              ((SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)list,fn);
    if (local_30 == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x268,"(tail != nullptr)","tail != nullptr");
      if (!bVar2) {
LAB_006b4275:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    (local_30->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
    super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next =
         (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->partialHeapBlockList;
    this->partialHeapBlockList =
         (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)list;
  }
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    if (list != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
      AppendAllocableHeapBlockList
                (&this->
                  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                 ,(SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)list);
    }
    bVar2 = false;
  }
  else {
    if (list != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = (this->
               super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
               ).heapBlockList;
      if (pSVar6 == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        ppSVar7 = (SmallHeapBlockT<MediumAllocationBlockAttributes> **)
                  &(this->
                   super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                   ).heapBlockList;
      }
      else {
        pSVar6 = HeapBlockList::
                 Tail<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                           (pSVar6);
        ppSVar7 = &(pSVar6->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                   super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      }
      *ppSVar7 = list;
    }
    uVar3 = HeapBucket::GetMediumBucketIndex((HeapBucket *)this);
    if ((recyclerSweep->mediumWithBarrierData).bucketData[uVar3].pendingSweepList ==
        (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
      StartAllocationAfterSweep
                (&this->
                  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                );
    }
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,bVar2);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::FinishPartialCollect(RecyclerSweep * recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));

    Assert(this->GetRecycler()->inPartialCollectMode);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped() || this->AllocationsStartedDuringConcurrentSweep());
#else
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped());
#endif

#if ENABLE_CONCURRENT_GC
    // Process the partial Swept block and move it to the partial heap block list
    TBlockType * partialSweptList = this->partialSweptHeapBlockList;
    if (partialSweptList)
    {
        this->partialSweptHeapBlockList = nullptr;
        TBlockType *  tail = nullptr;
        HeapBlockList::ForEach(partialSweptList, [this, &tail](TBlockType * heapBlock)
        {
            heapBlock->FinishPartialCollect();
            Assert(heapBlock->HasFreeObject());
            tail = heapBlock;
        });
        Assert(tail != nullptr);
        tail->SetNextBlock(this->partialHeapBlockList);
        this->partialHeapBlockList = partialSweptList;
    }
#endif

    TBlockType * currentPartialHeapBlockList = this->partialHeapBlockList;
    if (recyclerSweep == nullptr)
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            this->AppendAllocableHeapBlockList(currentPartialHeapBlockList);
        }
    }
    else
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            TBlockType * list = this->heapBlockList;
            if (list == nullptr)
            {
                this->heapBlockList = currentPartialHeapBlockList;
            }
            else
            {
                // CONCURRENT-TODO: Optimize this?
                TBlockType * tail = HeapBlockList::Tail(this->heapBlockList);
                tail->SetNextBlock(currentPartialHeapBlockList);
            }
        }
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr && !this->AllocationsStartedDuringConcurrentSweep())
#else
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr)
#endif
#endif
        {
            // nothing else to sweep now,  we can start allocating now.
            this->StartAllocationAfterSweep();
        }
    }

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));
}